

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O2

void __thiscall
efsw::DirWatcherGeneric::moveDirectory(DirWatcherGeneric *this,string *oldDir,string *newDir)

{
  DirWatchMap *this_00;
  DirWatcherGeneric *this_01;
  iterator iVar1;
  mapped_type *ppDVar2;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  FileSystem::dirRemoveSlashAtEnd(oldDir);
  std::__cxx11::string::string((string *)&local_40,(string *)oldDir);
  FileSystem::fileNameFromPath(&local_a0,&local_40);
  std::__cxx11::string::operator=((string *)oldDir,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_40);
  FileSystem::dirRemoveSlashAtEnd(newDir);
  std::__cxx11::string::string((string *)&local_60,(string *)newDir);
  FileSystem::fileNameFromPath(&local_a0,&local_60);
  std::__cxx11::string::operator=((string *)newDir,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_60);
  this_00 = &this->Directories;
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
          ::find(&this_00->_M_t,oldDir);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->Directories)._M_t._M_impl.super__Rb_tree_header) {
    this_01 = *(DirWatcherGeneric **)(iVar1._M_node + 2);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
    ::erase(&this_00->_M_t,(key_type *)(iVar1._M_node + 1));
    ppDVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
              ::operator[](this_00,newDir);
    *ppDVar2 = this_01;
    std::__cxx11::string::string((string *)&local_80,(string *)newDir);
    resetDirectory(this_01,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  return;
}

Assistant:

void DirWatcherGeneric::moveDirectory( std::string oldDir, std::string newDir ) {
	FileSystem::dirRemoveSlashAtEnd( oldDir );
	oldDir = FileSystem::fileNameFromPath( oldDir );

	FileSystem::dirRemoveSlashAtEnd( newDir );
	newDir = FileSystem::fileNameFromPath( newDir );

	DirWatcherGeneric* dw = NULL;
	DirWatchMap::iterator dit;

	/// Directory existed?
	dit = Directories.find( oldDir );

	if ( dit != Directories.end() ) {
		dw = dit->second;

		/// Remove the directory from the map
		Directories.erase( dit->first );

		Directories[newDir] = dw;

		dw->resetDirectory( newDir );
	}
}